

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::CharSet<char16_t>::IsSubsetOf(CharSet<char16_t> *this,CharSet<char16_t> *other)

{
  CharSetNode *pCVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint i;
  uint index;
  bool bVar5;
  
  if ((this->rep).compact.countPlusOne - 1 < 5) {
    index = 0;
    do {
      uVar3 = GetCompactLength(this);
      bVar5 = uVar3 <= index;
      if (bVar5) {
        return bVar5;
      }
      uVar3 = GetCompactCharU(this,index);
      bVar2 = Get(other,(Char)uVar3);
      index = index + 1;
    } while (bVar2);
  }
  else {
    if ((4 < (other->rep).compact.countPlusOne - 1) &&
       (bVar5 = CharBitvec::IsSubsetOf(&(this->rep).full.direct,&(other->rep).full.direct), bVar5))
    {
      pCVar1 = (this->rep).full.root;
      if (pCVar1 == (CharSetNode *)0x0) {
        return true;
      }
      if ((other->rep).compact.countPlusOne != 0) {
        iVar4 = (*pCVar1->_vptr_CharSetNode[9])(pCVar1,2);
        return SUB41(iVar4,0);
      }
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool CharSet<char16>::IsSubsetOf(const CharSet<Char>& other) const
    {
        if (IsCompact())
        {
            for (uint i = 0; i < this->GetCompactLength(); i++)
            {
                if (!other.Get(this->GetCompactChar(i)))
                    return false;
            }
            return true;
        }
        else
        {
            if (other.IsCompact())
                return false;
            if (!rep.full.direct.IsSubsetOf(other.rep.full.direct))
                return false;
            if (rep.full.root == nullptr)
                return true;
            if (other.rep.full.root == nullptr)
                return false;
            return rep.full.root->IsSubsetOf(CharSetNode::levels - 1, other.rep.full.root);
        }
    }